

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-common.cpp
# Opt level: O3

void test_common<double>(uint length,double value)

{
  bool bVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  double dVar19;
  undefined1 auVar20 [12];
  undefined4 uVar21;
  undefined4 uVar22;
  __shared_count<(__gnu_cxx::_Lock_policy)2> __s;
  undefined1 (*pauVar23) [16];
  undefined1 (*pauVar24) [16];
  ulong uVar25;
  undefined8 *puVar26;
  uint uVar27;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var28;
  uint uVar29;
  int iVar30;
  ulong uVar31;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var32;
  uint uVar33;
  uint uVar34;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined4 uVar35;
  undefined4 uVar36;
  ulong uVar37;
  shared_ptr<double> pa;
  shared_ptr<double> pb;
  undefined1 local_68 [16];
  
  local_68._8_4_ = in_XMM0_Dc;
  local_68._0_8_ = value;
  local_68._12_4_ = in_XMM0_Dd;
  uVar31 = 0xffffffffffffffff;
  if (-1 < (int)(length + 1)) {
    uVar31 = (ulong)(length + 1) * 8;
  }
  pauVar23 = (undefined1 (*) [16])operator_new__(uVar31);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<double*,void(*)(double*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pa,pauVar23,nosimd::common::free<double>
            );
  pa.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new__(uVar31);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<double*,void(*)(double*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pb,
             pa.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             nosimd::common::free<double>);
  __s._M_pi = pa.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  uVar31 = (ulong)length;
  *(undefined8 *)(*pauVar23 + uVar31 * 8) = 0x405fc00000000000;
  (&(pa.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _vptr__Sp_counted_base)[uVar31] = (_func_int **)0x404f800000000000;
  uVar35 = SUB84(value,0);
  uVar36 = (undefined4)((ulong)value >> 0x20);
  pauVar24 = pauVar23;
  uVar27 = length;
  uVar29 = length;
  if (7 < (int)length) {
    do {
      auVar3._8_4_ = uVar35;
      auVar3._0_8_ = value;
      auVar3._12_4_ = uVar36;
      *pauVar24 = auVar3;
      auVar4._8_4_ = uVar35;
      auVar4._0_8_ = value;
      auVar4._12_4_ = uVar36;
      pauVar24[1] = auVar4;
      auVar5._8_4_ = uVar35;
      auVar5._0_8_ = value;
      auVar5._12_4_ = uVar36;
      pauVar24[2] = auVar5;
      auVar6._8_4_ = uVar35;
      auVar6._0_8_ = value;
      auVar6._12_4_ = uVar36;
      pauVar24[3] = auVar6;
      uVar27 = uVar29 - 8;
      pauVar24 = pauVar24 + 4;
      bVar1 = 0xf < uVar29;
      uVar29 = uVar27;
    } while (bVar1);
  }
  if (3 < (int)uVar27) {
    auVar7._8_4_ = uVar35;
    auVar7._0_8_ = value;
    auVar7._12_4_ = uVar36;
    *pauVar24 = auVar7;
    auVar8._8_4_ = uVar35;
    auVar8._0_8_ = value;
    auVar8._12_4_ = uVar36;
    pauVar24[1] = auVar8;
    uVar27 = uVar27 - 4;
    pauVar24 = pauVar24 + 2;
  }
  if (1 < (int)uVar27) {
    auVar9._8_4_ = uVar35;
    auVar9._0_8_ = value;
    auVar9._12_4_ = uVar36;
    *pauVar24 = auVar9;
    uVar27 = uVar27 - 2;
    pauVar24 = pauVar24 + 1;
  }
  if (uVar27 != 0) {
    *(double *)*pauVar24 = value;
  }
  if (length == 0) goto LAB_00107cf8;
  uVar25 = 0;
  do {
    if ((*(double *)(*pauVar23 + uVar25 * 8) != value) ||
       (NAN(*(double *)(*pauVar23 + uVar25 * 8)) || NAN(value))) {
      puVar26 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar26 = "void test_common(unsigned int, T) [T = double]";
      *(undefined4 *)(puVar26 + 1) = 0x16;
      *(uint *)((long)puVar26 + 0xc) = length;
      __cxa_throw(puVar26,&Exception::typeinfo,0);
    }
    uVar25 = uVar25 + 1;
  } while (uVar31 != uVar25);
  bVar1 = 3 < (int)length;
  pauVar24 = pauVar23;
  _Var32._M_pi = pa.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  uVar27 = length;
  if ((int)length < 4) {
    bVar1 = false;
    uVar29 = length;
  }
  else {
    do {
      uVar29 = *(uint *)(*pauVar24 + 8);
      uVar11 = *(uint *)(*pauVar24 + 0xc);
      uVar14 = *(uint *)pauVar24[1];
      uVar15 = *(uint *)(pauVar24[1] + 4);
      dVar19 = *(double *)pauVar24[2];
      uVar33 = *(uint *)*pauVar24;
      uVar34 = *(uint *)(*pauVar24 + 4);
      if (sse::internals::abs_pd(double(int))::sign_mask == '\0') {
        local_68._0_8_ = dVar19;
        pb.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
             *(uint *)*pauVar24;
        pb.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
             *(uint *)(*pauVar24 + 4);
        test_common<double>();
        uVar33 = (uint)pb.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        uVar34 = pb.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_;
        value = dVar19;
      }
      uVar22 = sse::internals::abs_pd(double(int))::sign_mask._12_4_;
      uVar21 = sse::internals::abs_pd(double(int))::sign_mask._8_4_;
      uVar36 = sse::internals::abs_pd(double(int))::sign_mask._4_4_;
      uVar35 = sse::internals::abs_pd(double(int))::sign_mask._0_4_;
      dVar19 = *(double *)pauVar24[2];
      if (sse::internals::abs_pd(double(int))::sign_mask == '\0') {
        pb.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = uVar33;
        pb.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = uVar34;
        test_common<double>();
        uVar33 = (uint)pb.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        uVar34 = pb.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_;
        value = (double)local_68._0_8_;
        dVar19 = (double)local_68._0_8_;
      }
      uVar16 = ~sse::internals::abs_pd(double(int))::sign_mask._0_4_;
      uVar17 = ~sse::internals::abs_pd(double(int))::sign_mask._4_4_;
      uVar12 = ~sse::internals::abs_pd(double(int))::sign_mask._8_4_;
      uVar13 = ~sse::internals::abs_pd(double(int))::sign_mask._12_4_;
      *(uint *)&(_Var32._M_pi)->_vptr__Sp_counted_base = ~uVar35 & uVar33;
      *(uint *)((long)&(_Var32._M_pi)->_vptr__Sp_counted_base + 4) = ~uVar36 & uVar34;
      (_Var32._M_pi)->_M_use_count = ~uVar21 & uVar29;
      (_Var32._M_pi)->_M_weak_count = ~uVar22 & uVar11;
      *(uint *)&_Var32._M_pi[1]._vptr__Sp_counted_base = uVar16 & uVar14;
      *(uint *)((long)&_Var32._M_pi[1]._vptr__Sp_counted_base + 4) = uVar17 & uVar15;
      _Var32._M_pi[1]._M_use_count = uVar12 & SUB84(dVar19,0);
      _Var32._M_pi[1]._M_weak_count = uVar13 & (uint)((ulong)dVar19 >> 0x20);
      uVar29 = uVar27 - 4;
      pauVar24 = pauVar24 + 2;
      _Var32._M_pi = _Var32._M_pi + 2;
      bVar2 = 7 < (int)uVar27;
      uVar27 = uVar29;
    } while (bVar2);
  }
  if (1 < (int)uVar29) {
    uVar27 = *(uint *)*pauVar24;
    uVar11 = *(uint *)(*pauVar24 + 4);
    uVar25 = *(ulong *)(*pauVar24 + 8);
    if (sse::internals::abs_pd(double(int))::sign_mask == '\0') {
      test_common<double>();
      value = (double)local_68._0_8_;
    }
    uVar14 = ~sse::internals::abs_pd(double(int))::sign_mask._4_4_;
    uVar25 = ~CONCAT44(sse::internals::abs_pd(double(int))::sign_mask._12_4_,
                       sse::internals::abs_pd(double(int))::sign_mask._8_4_) & uVar25;
    *(uint *)&(_Var32._M_pi)->_vptr__Sp_counted_base =
         ~sse::internals::abs_pd(double(int))::sign_mask._0_4_ & uVar27;
    *(uint *)((long)&(_Var32._M_pi)->_vptr__Sp_counted_base + 4) = uVar14 & uVar11;
    (_Var32._M_pi)->_M_use_count = (_Atomic_word)uVar25;
    (_Var32._M_pi)->_M_weak_count = (_Atomic_word)(uVar25 >> 0x20);
    uVar29 = uVar29 - 2;
    pauVar24 = pauVar24 + 1;
    _Var32._M_pi = _Var32._M_pi + 1;
  }
  if (uVar29 != 0) {
    uVar25 = *(ulong *)*pauVar24;
    if (sse::internals::abs_pd(double(int))::sign_mask == '\0') {
      test_common<double>();
      value = (double)local_68._0_8_;
    }
    (_Var32._M_pi)->_vptr__Sp_counted_base =
         (_func_int **)
         (~CONCAT44(sse::internals::abs_pd(double(int))::sign_mask._4_4_,
                    sse::internals::abs_pd(double(int))::sign_mask._0_4_) & uVar25);
  }
  pauVar24 = pauVar23;
  _Var32._M_pi = __s._M_pi;
  uVar27 = length;
  if (length == 0) {
LAB_00107c22:
    if (!bVar1) goto LAB_00107cf8;
LAB_00107c33:
    do {
      uVar25 = *(ulong *)*pauVar24;
      uVar37 = *(ulong *)(*pauVar24 + 8);
      local_68._0_4_ = *(undefined4 *)pauVar24[1];
      local_68._4_4_ = *(undefined4 *)(pauVar24[1] + 4);
      local_68._8_4_ = *(undefined4 *)(pauVar24[1] + 8);
      auVar20 = *(undefined1 (*) [12])pauVar24[1];
      uVar35 = *(undefined4 *)(pauVar24[1] + 0xc);
      if (sse::internals::abs_pd(double(int))::sign_mask == '\0') {
        test_common<double>();
        local_68._0_4_ = auVar20._0_4_;
        local_68._4_4_ = auVar20._4_4_;
        local_68._8_4_ = auVar20._8_4_;
      }
      uVar18 = CONCAT44(sse::internals::abs_pd(double(int))::sign_mask._4_4_,
                        sse::internals::abs_pd(double(int))::sign_mask._0_4_);
      uVar10 = CONCAT44(sse::internals::abs_pd(double(int))::sign_mask._12_4_,
                        sse::internals::abs_pd(double(int))::sign_mask._8_4_);
      if (sse::internals::abs_pd(double(int))::sign_mask == '\0') {
        test_common<double>();
      }
      uVar37 = ~uVar10 & uVar37;
      uVar29 = ~sse::internals::abs_pd(double(int))::sign_mask._0_4_;
      uVar11 = ~sse::internals::abs_pd(double(int))::sign_mask._4_4_;
      uVar10 = ~CONCAT44(sse::internals::abs_pd(double(int))::sign_mask._12_4_,
                         sse::internals::abs_pd(double(int))::sign_mask._8_4_) &
               CONCAT44(uVar35,local_68._8_4_);
      (_Var32._M_pi)->_vptr__Sp_counted_base = (_func_int **)(~uVar18 & uVar25);
      (_Var32._M_pi)->_M_use_count = (int)uVar37;
      (_Var32._M_pi)->_M_weak_count = (int)(uVar37 >> 0x20);
      *(uint *)&_Var32._M_pi[1]._vptr__Sp_counted_base = uVar29 & local_68._0_4_;
      *(uint *)((long)&_Var32._M_pi[1]._vptr__Sp_counted_base + 4) = uVar11 & local_68._4_4_;
      _Var32._M_pi[1]._M_use_count = (_Atomic_word)uVar10;
      _Var32._M_pi[1]._M_weak_count = (_Atomic_word)(uVar10 >> 0x20);
      uVar29 = uVar27 - 4;
      pauVar24 = pauVar24 + 2;
      _Var32._M_pi = _Var32._M_pi + 2;
      bVar1 = 7 < (int)uVar27;
      uVar27 = uVar29;
    } while (bVar1);
  }
  else {
    uVar25 = 0;
    do {
      if (((double)(&(__s._M_pi)->_vptr__Sp_counted_base)[uVar25] != value) ||
         (NAN((double)(&(__s._M_pi)->_vptr__Sp_counted_base)[uVar25]) || NAN(value))) {
        puVar26 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar26 = "void test_common(unsigned int, T) [T = double]";
        *(undefined4 *)(puVar26 + 1) = 0x1d;
        *(uint *)((long)puVar26 + 0xc) = length;
        __cxa_throw(puVar26,&Exception::typeinfo,0);
      }
      uVar25 = uVar25 + 1;
    } while (uVar31 != uVar25);
    _Var28._M_pi = __s._M_pi;
    uVar29 = length;
    if (7 < (int)length) {
      iVar30 = length - 0xf;
      if (length < 0xf) {
        iVar30 = 0;
      }
      uVar25 = (ulong)(iVar30 + 7U >> 3);
      memset(__s._M_pi,0,uVar25 * 0x40 + 0x40);
      uVar29 = (length - (iVar30 + 7U & 0x7ffffff8)) - 8;
      _Var28._M_pi = __s._M_pi + uVar25 * 4 + 4;
    }
    if (3 < (int)uVar29) {
      uVar29 = uVar29 - 4;
      _Var28._M_pi[1]._vptr__Sp_counted_base = (_func_int **)0x0;
      _Var28._M_pi[1]._M_use_count = 0;
      _Var28._M_pi[1]._M_weak_count = 0;
      (_Var28._M_pi)->_vptr__Sp_counted_base = (_func_int **)0x0;
      (_Var28._M_pi)->_M_use_count = 0;
      (_Var28._M_pi)->_M_weak_count = 0;
      _Var28._M_pi = _Var28._M_pi + 2;
    }
    if (1 < (int)uVar29) {
      (_Var28._M_pi)->_vptr__Sp_counted_base = (_func_int **)0x0;
      (_Var28._M_pi)->_M_use_count = 0;
      (_Var28._M_pi)->_M_weak_count = 0;
      uVar29 = uVar29 - 2;
      _Var28._M_pi = _Var28._M_pi + 1;
    }
    if (uVar29 != 0) {
      (_Var28._M_pi)->_vptr__Sp_counted_base = (_func_int **)0x0;
    }
    if (length == 0) goto LAB_00107c22;
    uVar25 = 0;
    do {
      if (((double)(&(__s._M_pi)->_vptr__Sp_counted_base)[uVar25] != 0.0) ||
         (NAN((double)(&(__s._M_pi)->_vptr__Sp_counted_base)[uVar25]))) {
        puVar26 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar26 = "void test_common(unsigned int, T) [T = double]";
        *(undefined4 *)(puVar26 + 1) = 0x24;
        *(uint *)((long)puVar26 + 0xc) = length;
        __cxa_throw(puVar26,&Exception::typeinfo,0);
      }
      uVar25 = uVar25 + 1;
    } while (uVar31 != uVar25);
    if (length != 0) {
      uVar25 = 0;
      do {
        *(double *)(*pauVar23 + uVar25 * 8) = (double)(uVar25 & 0xffffffff);
        uVar25 = uVar25 + 1;
      } while (uVar31 != uVar25);
    }
    uVar29 = length;
    if (bVar1) goto LAB_00107c33;
  }
  if (1 < (int)uVar29) {
    local_68._0_4_ = *(undefined4 *)*pauVar24;
    local_68._4_4_ = *(undefined4 *)(*pauVar24 + 4);
    local_68._8_4_ = *(undefined4 *)(*pauVar24 + 8);
    auVar20 = *(undefined1 (*) [12])*pauVar24;
    uVar35 = *(undefined4 *)(*pauVar24 + 0xc);
    if (sse::internals::abs_pd(double(int))::sign_mask == '\0') {
      test_common<double>();
      local_68._0_4_ = auVar20._0_4_;
      local_68._4_4_ = auVar20._4_4_;
      local_68._8_4_ = auVar20._8_4_;
    }
    uVar27 = ~sse::internals::abs_pd(double(int))::sign_mask._4_4_;
    uVar25 = ~CONCAT44(sse::internals::abs_pd(double(int))::sign_mask._12_4_,
                       sse::internals::abs_pd(double(int))::sign_mask._8_4_) &
             CONCAT44(uVar35,local_68._8_4_);
    *(undefined4 *)&(_Var32._M_pi)->_vptr__Sp_counted_base =
         ~sse::internals::abs_pd(double(int))::sign_mask._0_4_ & local_68._0_4_;
    *(uint *)((long)&(_Var32._M_pi)->_vptr__Sp_counted_base + 4) = uVar27 & local_68._4_4_;
    (_Var32._M_pi)->_M_use_count = (_Atomic_word)uVar25;
    (_Var32._M_pi)->_M_weak_count = (_Atomic_word)(uVar25 >> 0x20);
    uVar29 = uVar29 - 2;
    pauVar24 = pauVar24 + 1;
    _Var32._M_pi = _Var32._M_pi + 1;
  }
  if (uVar29 != 0) {
    uVar25 = *(ulong *)*pauVar24;
    if (sse::internals::abs_pd(double(int))::sign_mask == '\0') {
      test_common<double>();
    }
    (_Var32._M_pi)->_vptr__Sp_counted_base =
         (_func_int **)
         (~CONCAT44(sse::internals::abs_pd(double(int))::sign_mask._4_4_,
                    sse::internals::abs_pd(double(int))::sign_mask._0_4_) & uVar25);
  }
  if (length != 0) {
    uVar25 = 0;
    do {
      if (((double)(&(__s._M_pi)->_vptr__Sp_counted_base)[uVar25] != (double)(uVar25 & 0xffffffff))
         || (NAN((double)(&(__s._M_pi)->_vptr__Sp_counted_base)[uVar25]) ||
             NAN((double)(uVar25 & 0xffffffff)))) {
        puVar26 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar26 = "void test_common(unsigned int, T) [T = double]";
        *(undefined4 *)(puVar26 + 1) = 0x2d;
        *(uint *)((long)puVar26 + 0xc) = length;
        __cxa_throw(puVar26,&Exception::typeinfo,0);
      }
      uVar25 = uVar25 + 1;
    } while (uVar31 != uVar25);
  }
LAB_00107cf8:
  if ((((*(double *)(*pauVar23 + uVar31 * 8) == 127.0) &&
       (!NAN(*(double *)(*pauVar23 + uVar31 * 8)))) &&
      ((double)(&(__s._M_pi)->_vptr__Sp_counted_base)[uVar31] == 63.0)) &&
     (!NAN((double)(&(__s._M_pi)->_vptr__Sp_counted_base)[uVar31]))) {
    if (pb.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 pb.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    if (pa.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 pa.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    return;
  }
  puVar26 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar26 = "void test_common(unsigned int, T) [T = double]";
  *(undefined4 *)(puVar26 + 1) = 0x31;
  *(uint *)((long)puVar26 + 0xc) = length;
  __cxa_throw(puVar26,&Exception::typeinfo,0);
}

Assistant:

void test_common(unsigned length, T value = 42)
{
    std::shared_ptr<T> pa = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    std::shared_ptr<T> pb = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * a = pa.get();
    T * b = pb.get();
    a[length] = 0x7f;
    b[length] = 0x3f;

    simd::set(value, a, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (a[i] != value)
            FAIL();
    }

    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != value)
            FAIL();
    }

    simd::zero(b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != 0)
            FAIL();
    }

    for (unsigned i=0; i<length; ++i)
        a[i] = i;
    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != (T)i)
            FAIL();
    }

    if (a[length] != 0x7f || b[length] != 0x3f)
        FAIL();
}